

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsByAutoPartitionAsync
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          double *outSumLogLikelihoodByPartition)

{
  threadData *ptVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int i;
  long lVar5;
  int local_fc;
  __shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2> local_f8;
  double *local_e0;
  int *local_d8;
  double *local_d0;
  int *local_c8;
  BeagleCPUImpl<float,_1,_0> *local_c0;
  packaged_task<void_()> threadTask;
  int *cumulativeScaleIndices_local;
  int *stateFrequenciesIndices_local;
  int *categoryWeightsIndices_local;
  int *bufferIndices_local;
  unique_lock<std::mutex> l;
  
  lVar5 = 0x88;
  lVar4 = 0;
  cumulativeScaleIndices_local = cumulativeScaleIndices;
  stateFrequenciesIndices_local = stateFrequenciesIndices;
  categoryWeightsIndices_local = categoryWeightsIndices;
  bufferIndices_local = bufferIndices;
  for (lVar3 = 0; uVar2 = (ulong)this->kNumThreads, lVar3 < (long)uVar2; lVar3 = lVar3 + 1) {
    local_f8 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0x251);
    local_fc = 1;
    local_e0 = outSumLogLikelihoodByPartition;
    local_d8 = partitionIndices;
    local_d0 = outSumLogLikelihoodByPartition;
    local_c8 = partitionIndices;
    local_c0 = this;
    std::
    _Bind<void(beagle::cpu::BeagleCPUImpl<float,1,0>::*(beagle::cpu::BeagleCPUImpl<float,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
    ::
    _Bind<beagle::cpu::BeagleCPUImpl<float,1,0>*,int_const*&,int_const*&,int_const*&,int_const*&,int_const*,int,double*>
              ((_Bind<void(beagle::cpu::BeagleCPUImpl<float,1,0>::*(beagle::cpu::BeagleCPUImpl<float,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
                *)&l,(offset_in_BeagleCPUImpl<float,_1,_0>_to_subr *)&local_f8,&local_c0,
               &bufferIndices_local,&categoryWeightsIndices_local,&stateFrequenciesIndices_local,
               &cumulativeScaleIndices_local,&local_c8,&local_fc,&local_d0);
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<float,1,0>::*(beagle::cpu::BeagleCPUImpl<float,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              ((packaged_task<void()> *)&threadTask,
               (_Bind<void_(beagle::cpu::BeagleCPUImpl<float,_1,_0>::*(beagle::cpu::BeagleCPUImpl<float,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
                *)&l);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&local_f8);
    l._M_device = (mutex_type *)local_f8._M_ptr;
    l._8_8_ = local_f8._M_refcount._M_pi;
    local_f8 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                )(ZEXT816(0) << 0x20);
    std::shared_future<void>::operator=
              ((shared_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar4),(shared_future<void> *)&l);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&l._M_owns);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
    ptVar1 = this->gThreads;
    std::unique_lock<std::mutex>::unique_lock
              (&l,(mutex_type *)((long)&(ptVar1->t)._M_id._M_thread + lVar5));
    bufferIndices = (int *)&threadTask;
    std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
    emplace_back<std::packaged_task<void()>>
              ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
               ((long)ptVar1 + lVar5 + -0x80),(packaged_task<void_()> *)bufferIndices);
    std::unique_lock<std::mutex>::unlock(&l);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(&l);
    std::packaged_task<void_()>::~packaged_task(&threadTask);
    lVar5 = lVar5 + 0xb8;
    lVar4 = lVar4 + 0x10;
    outSumLogLikelihoodByPartition = local_e0 + 1;
    partitionIndices = local_d8 + 1;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar3),bufferIndices);
    uVar2 = (ulong)(uint)this->kNumThreads;
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByAutoPartitionAsync(
                                                        const int* bufferIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        double* outSumLogLikelihoodByPartition) {

    for (int i=0; i<kNumThreads; i++) {

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition, this,
                      bufferIndices, categoryWeightsIndices,
                      stateFrequenciesIndices, cumulativeScaleIndices,
                      &partitionIndices[i], 1,
                      &outSumLogLikelihoodByPartition[i]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}